

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

string * __thiscall
pstore::http::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int error)

{
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [16];
  allocator local_1d;
  int local_1c;
  error_category *peStack_18;
  int error_local;
  error_category *this_local;
  
  local_1c = error;
  peStack_18 = this;
  this_local = (error_category *)__return_storage_ptr__;
  switch(error) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Bad request",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Bad WebSocket version requested",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Not implemented",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"String too long",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Refill result out of range",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"unknown pstore::category error",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message (int const error) const {
            switch (static_cast<error_code> (error)) {
            case error_code::bad_request: return "Bad request";
            case error_code::bad_websocket_version: return "Bad WebSocket version requested";
            case error_code::not_implemented: return "Not implemented";
            case error_code::string_too_long: return "String too long";
            case error_code::refill_out_of_range: return "Refill result out of range";
            }
            return "unknown pstore::category error";
        }